

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void nn_timer_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_timer *timer;
  nn_worker_timer *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    *(undefined4 *)(local_28 + 0x58) = 3;
    nn_worker_execute((nn_worker *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (nn_worker_task *)in_stack_ffffffffffffffb8);
  }
  else {
    if (*(int *)(local_28 + 0x58) != 3) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
              ,0x70);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI == 2) {
      if (in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","type == NN_WORKER_TASK_EXECUTE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/timer.c"
                ,0x69);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_worker_rm_timer((nn_worker *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
      *(undefined4 *)(local_28 + 0x58) = 1;
      nn_fsm_stopped((nn_fsm *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
  }
  return;
}

Assistant:

static void nn_timer_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_timer *timer;

    timer = nn_cont (self, struct nn_timer, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        timer->state = NN_TIMER_STATE_STOPPING;
        nn_worker_execute (timer->worker, &timer->stop_task);
        return;
    }
    if (nn_slow (timer->state == NN_TIMER_STATE_STOPPING)) {
        if (src != NN_TIMER_SRC_STOP_TASK)
            return;
        nn_assert (type == NN_WORKER_TASK_EXECUTE);
        nn_worker_rm_timer (timer->worker, &timer->wtimer);
        timer->state = NN_TIMER_STATE_IDLE;
        nn_fsm_stopped (&timer->fsm, NN_TIMER_STOPPED);
        return;
    }

    nn_fsm_bad_state(timer->state, src, type);
}